

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_true> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
::
binary_search_impl<std::__cxx11::string,absl::lts_20250127::container_internal::StringBtreeDefaultLess>
          (btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
           *this,string *k,size_type s,StringBtreeDefaultLess *e,StringBtreeDefaultLess *comp)

{
  bool bVar1;
  key_type *this_00;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  string_view sVar2;
  SearchResult<unsigned_long,_true> SVar3;
  OnlyLiteralZero local_7c;
  value_type local_7b;
  OnlyLiteralZero local_7a;
  value_type local_79;
  string_view local_78;
  string_view local_68;
  value_type local_51;
  StringBtreeDefaultLess *pSStack_50;
  weak_ordering c;
  size_type mid;
  StringBtreeDefaultLess *comp_local;
  size_type e_local;
  size_type s_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *this_local;
  StringBtreeDefaultLess *local_18;
  undefined1 local_10;
  
  comp_local = e;
  e_local = s;
LAB_0031d157:
  do {
    if ((StringBtreeDefaultLess *)e_local == comp_local) {
      local_18 = (StringBtreeDefaultLess *)e_local;
      local_10 = 1;
LAB_0031d245:
      SVar3._9_7_ = (undefined7)(s >> 8);
      SVar3.match = local_10;
      SVar3.value = (unsigned_long)local_18;
      return SVar3;
    }
    pSStack_50 = (StringBtreeDefaultLess *)((ulong)(comp_local + e_local) >> 1);
    this_00 = btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
              ::key((btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                     *)this,(size_type)pSStack_50);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00)
    ;
    local_68 = sVar2;
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(k);
    local_78 = sVar2;
    local_79 = (value_type)StringBtreeDefaultLess::operator()(comp,local_68,sVar2);
    local_51 = local_79;
    compare_internal::OnlyLiteralZero::OnlyLiteralZero(&local_7a,0);
    bVar1 = lts_20250127::operator<(local_79);
    if (!bVar1) {
      local_7b = local_51;
      compare_internal::OnlyLiteralZero::OnlyLiteralZero(&local_7c,0);
      bVar1 = operator>(local_7b);
      s = extraout_RDX_00;
      if (!bVar1) {
        local_18 = pSStack_50;
        local_10 = 0;
        goto LAB_0031d245;
      }
      comp_local = pSStack_50;
      goto LAB_0031d157;
    }
    e_local = (size_type)(pSStack_50 + 1);
    s = extraout_RDX;
  } while( true );
}

Assistant:

SearchResult<size_type, true> binary_search_impl(
      const K &k, size_type s, size_type e, const CompareTo &comp,
      std::true_type /* IsCompareTo */) const {
    if (params_type::template can_have_multiple_equivalent_keys<K>()) {
      MatchKind exact_match = MatchKind::kNe;
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else {
          e = mid;
          if (c == 0) {
            // Need to return the first value whose key is not less than k,
            // which requires continuing the binary search if there could be
            // multiple equivalent keys.
            exact_match = MatchKind::kEq;
          }
        }
      }
      return {s, exact_match};
    } else {  // Can't have multiple equivalent keys.
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else if (c > 0) {
          e = mid;
        } else {
          return {mid, MatchKind::kEq};
        }
      }
      return {s, MatchKind::kNe};
    }
  }